

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

void __thiscall Entity::Entity(Entity *this,int _hp,int _mp,int _atk)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->hp = _hp;
  this->mp = _mp;
  this->hp_max = _hp;
  this->mp_max = _mp;
  this->atk = _atk;
  std::__cxx11::string::_M_replace((ulong)&this->name,0,(char *)0x0,0x116223);
  return;
}

Assistant:

Entity::Entity(int _hp,int _mp,int _atk){
    hp = _hp;
    mp = _mp;
    hp_max = hp;
    mp_max = mp;
    atk = _atk;
    name = "勇者";
}